

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::Expression::visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
          (Expression *this,Expression *expr,ExpressionPrinter *visitor)

{
  long lVar1;
  long lVar2;
  Expression *pEVar3;
  logic_error *this_00;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  long lVar7;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    switch((((CallExpression *)expr)->super_Expression).kind) {
    case Invalid:
    case RealLiteral:
    case TimeLiteral:
    case UnbasedUnsizedIntegerLiteral:
    case NullLiteral:
    case UnboundedLiteral:
    case HierarchicalValue:
    case MemberAccess:
    case DataType:
    case TypeReference:
    case HierarchicalReference:
    case EmptyArgument:
      goto switchD_0014a558_caseD_0;
    case IntegerLiteral:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(IntegerLiteral *)expr);
      return;
    case StringLiteral:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(StringLiteral *)expr);
      return;
    case NamedValue:
      lVar1 = *(long *)&(((CallExpression *)expr)->subroutine).
                        super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        ._M_u;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&visitor->field_0x18,*(char **)(lVar1 + 0x10),*(long *)(lVar1 + 8));
      return;
    case UnaryOp:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(UnaryExpression *)expr);
      return;
    case BinaryOp:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(BinaryExpression *)expr);
      return;
    case ConditionalOp:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(ConditionalExpression *)expr);
      return;
    case Inside:
      InsideExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>((InsideExpression *)expr,visitor);
      return;
    case Assignment:
      pEVar3 = *(Expression **)
                ((long)&(((CallExpression *)expr)->subroutine).
                        super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                + 0x10);
      visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
                (pEVar3,pEVar3,visitor);
      expr = *(Expression **)
              ((long)&(((CallExpression *)expr)->subroutine).
                      super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
              + 0x18);
      break;
    case Concatenation:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(ConcatenationExpression *)expr);
      return;
    case Replication:
    case OpenRange:
      pEVar3 = *(Expression **)
                &(((CallExpression *)expr)->subroutine).
                 super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 ._M_u;
      visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
                (pEVar3,pEVar3,visitor);
    case Conversion:
      expr = *(Expression **)
              ((long)&(((CallExpression *)expr)->subroutine).
                      super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
              + 8);
      break;
    case Streaming:
      StreamingConcatenationExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
                ((StreamingConcatenationExpression *)expr,visitor);
      return;
    case ElementSelect:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(ElementSelectExpression *)expr);
      return;
    case RangeSelect:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(RangeSelectExpression *)expr);
      return;
    case Call:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(CallExpression *)expr);
      return;
    case LValueReference:
      hgdb::rtl::ExpressionPrinter::handle(visitor,(LValueReferenceExpression *)expr);
      return;
    case SimpleAssignmentPattern:
      lVar1 = *(long *)((long)&(((CallExpression *)expr)->subroutine).
                               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                       + 8);
      if (lVar1 == 0) {
        return;
      }
      lVar2 = *(long *)&(((CallExpression *)expr)->subroutine).
                        super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        ._M_u;
      lVar7 = 0;
      do {
        pEVar3 = *(Expression **)(lVar2 + lVar7);
        visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
                  (pEVar3,pEVar3,visitor);
        lVar7 = lVar7 + 8;
      } while (lVar1 << 3 != lVar7);
      return;
    case StructuredAssignmentPattern:
      lVar1 = *(long *)((long)&(((CallExpression *)expr)->subroutine).
                               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                       + 8);
      if (lVar1 == 0) {
        return;
      }
      lVar2 = *(long *)&(((CallExpression *)expr)->subroutine).
                        super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        ._M_u;
      lVar7 = 0;
      do {
        pEVar3 = *(Expression **)(lVar2 + lVar7);
        visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
                  (pEVar3,pEVar3,visitor);
        lVar7 = lVar7 + 8;
      } while (lVar1 << 3 != lVar7);
      return;
    case ReplicatedAssignmentPattern:
      pEVar3 = *(Expression **)
                ((long)&(((CallExpression *)expr)->subroutine).
                        super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                + 0x10);
      visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
                (pEVar3,pEVar3,visitor);
      lVar1 = *(long *)((long)&(((CallExpression *)expr)->subroutine).
                               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                       + 8);
      if (lVar1 == 0) {
        return;
      }
      lVar2 = *(long *)&(((CallExpression *)expr)->subroutine).
                        super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        ._M_u;
      lVar7 = 0;
      do {
        pEVar3 = *(Expression **)(lVar2 + lVar7);
        visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
                  (pEVar3,pEVar3,visitor);
        lVar7 = lVar7 + 8;
      } while (lVar1 << 3 != lVar7);
      return;
    case Dist:
      DistExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>((DistExpression *)expr,visitor);
      return;
    case NewArray:
      NewArrayExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
                ((NewArrayExpression *)expr,visitor);
      return;
    case NewClass:
    case TaggedUnion:
      expr = *(Expression **)
              ((long)&(((CallExpression *)expr)->subroutine).
                      super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      .
                      super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
              + 8);
      if ((CallExpression *)expr == (CallExpression *)0x0) {
switchD_0014a558_caseD_0:
        return;
      }
      break;
    case NewCovergroup:
      lVar1 = *(long *)((long)&(((CallExpression *)expr)->subroutine).
                               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                               .
                               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                       + 8);
      if (lVar1 == 0) {
        return;
      }
      lVar2 = *(long *)&(((CallExpression *)expr)->subroutine).
                        super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        ._M_u;
      lVar7 = 0;
      do {
        pEVar3 = *(Expression **)(lVar2 + lVar7);
        visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
                  (pEVar3,pEVar3,visitor);
        lVar7 = lVar7 + 8;
      } while (lVar1 << 3 != lVar7);
      return;
    case CopyClass:
    case MinTypMax:
      expr = *(Expression **)
              &(((CallExpression *)expr)->subroutine).
               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               ._M_u;
      break;
    case ClockingEvent:
      TimingControl::visit<hgdb::rtl::ExpressionPrinter>
                (*(TimingControl **)
                  &(((CallExpression *)expr)->subroutine).
                   super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   ._M_u,visitor);
      return;
    case AssertionInstance:
      AssertionInstanceExpression::visitExprs<hgdb::rtl::ExpressionPrinter&>
                ((AssertionInstanceExpression *)expr,visitor);
      return;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0.field_2._8_8_ = plVar4[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar5;
      }
      local_d0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x15b);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar4;
      plVar6 = plVar4 + 2;
      if (local_b0 == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = plVar4[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar6;
      }
      local_a8 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar4;
      plVar6 = plVar4 + 2;
      if (local_f0 == plVar6) {
        local_e0 = *plVar6;
        lStack_d8 = plVar4[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar6;
      }
      local_e8 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  } while( true );
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}